

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O2

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadSkeletonAnimationLink
          (OgreBinarySerializer *this,Skeleton *param_1)

{
  string local_30;
  
  ReadLine_abi_cxx11_(&local_30,this);
  std::__cxx11::string::~string((string *)&local_30);
  SkipBytes(this,0xc);
  return;
}

Assistant:

void OgreBinarySerializer::ReadSkeletonAnimationLink(Skeleton * /*skeleton*/)
{
    // Skip bounds, not compatible with Assimp.
    ReadLine(); // skeleton name
    SkipBytes(sizeof(float) * 3); // scale
}